

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorCommon.cxx
# Opt level: O2

bool cmQtAutoGeneratorCommon::RccListInputs
               (string *qtMajorVersion,string *rccCommand,string *fileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,string *errorMessage)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  istream *piVar6;
  char *pcVar7;
  long lVar8;
  string qrcDir;
  string qrcContents;
  string qrcEntry;
  string tag;
  int retVal;
  ostringstream ost;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [23];
  ifstream ifs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  uint auStack_218 [122];
  
  bVar2 = cmsys::SystemTools::FileExists((fileName->_M_dataplus)._M_p);
  if (!bVar2) {
    if (errorMessage != (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"AutoRcc: Error: Rcc file does not exist:\n");
      Quoted((string *)&ost,fileName);
      poVar5 = std::operator<<(poVar5,(string *)&ost);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&ost);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)errorMessage,(string *)&ost);
      std::__cxx11::string::~string((string *)&ost);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    }
    return false;
  }
  bVar2 = std::operator==(qtMajorVersion,"4");
  if (!bVar2) {
    if (rccCommand->_M_string_length == 0) {
      cmSystemTools::Error
                ("AutoRcc: Error: rcc executable not available\n",(char *)0x0,(char *)0x0,
                 (char *)0x0);
      return false;
    }
    qrcContents._M_dataplus._M_p = (pointer)0x0;
    qrcContents._M_string_length = 0;
    qrcContents.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qrcContents,rccCommand);
    std::__cxx11::string::string((string *)&ifs,"--help",(allocator *)&ost);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&qrcContents,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
    _ifs = (pointer)&local_228;
    local_228._M_local_buf[0] = '\0';
    _ost = (pointer)local_3a8;
    local_3a8[0]._M_allocated_capacity = local_3a8[0]._M_allocated_capacity & 0xffffffffffffff00;
    qrcDir._M_dataplus._M_p = (pointer)((ulong)qrcDir._M_dataplus._M_p._4_4_ << 0x20);
    bVar2 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&qrcContents,(string *)&ifs,(string *)&ost,(int *)&qrcDir,(char *)0x0,
                       OUTPUT_NONE,0.0,Auto);
    if (bVar2 && (int)qrcDir._M_dataplus._M_p == 0) {
      lVar8 = std::__cxx11::string::find((char *)&ifs,0x57a3ee);
      pcVar7 = "-list";
      if (lVar8 != -1) {
        pcVar7 = "--list";
      }
    }
    else {
      pcVar7 = "-list";
    }
    std::__cxx11::string::~string((string *)&ost);
    std::__cxx11::string::~string((string *)&ifs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&qrcContents);
    retVal = 0;
    qrcContents._M_string_length = 0;
    qrcDir._M_dataplus._M_p = (pointer)&qrcDir.field_2;
    qrcDir._M_string_length = 0;
    qrcContents.field_2._M_allocated_capacity =
         qrcContents.field_2._M_allocated_capacity & 0xffffffffffffff00;
    qrcDir.field_2._M_local_buf[0] = '\0';
    _ost = (pointer)0x0;
    local_3a8[0]._M_allocated_capacity = 0;
    qrcContents._M_dataplus._M_p = (pointer)&qrcContents.field_2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ost,rccCommand);
    std::__cxx11::string::string((string *)&ifs,pcVar7,(allocator *)&qrcEntry);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ost,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ost,fileName);
    bVar2 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ost,&qrcContents,&qrcDir,&retVal,(char *)0x0,OUTPUT_NONE,0.0,Auto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ost);
    if (bVar2 && retVal == 0) {
      std::__cxx11::istringstream::istringstream((istringstream *)&ifs,(string *)&qrcContents,_S_in)
      ;
      _ost = (pointer)local_3a8;
      local_3a8[0]._M_allocated_capacity = local_3a8[0]._M_allocated_capacity & 0xffffffffffffff00;
      while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&ifs,(string *)&ost),
            ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
        utilStripCR(&qrcEntry,(string *)&ost);
        std::__cxx11::string::operator=((string *)&ost,(string *)&qrcEntry);
        std::__cxx11::string::~string((string *)&qrcEntry);
      }
      std::__cxx11::string::~string((string *)&ost);
      std::__cxx11::istringstream::~istringstream((istringstream *)&ifs);
      std::__cxx11::istringstream::istringstream((istringstream *)&ifs,(string *)&qrcDir,_S_in);
      qrcEntry._M_dataplus._M_p = (pointer)&qrcEntry.field_2;
      qrcEntry._M_string_length = 0;
      qrcEntry.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&ifs,(string *)&qrcEntry);
        bVar2 = ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0;
        if (bVar2) break;
        utilStripCR((string *)&ost,&qrcEntry);
        std::__cxx11::string::operator=((string *)&qrcEntry,(string *)&ost);
        std::__cxx11::string::~string((string *)&ost);
        bVar3 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                          (&qrcEntry,(char (*) [14])"RCC: Error in");
        if (bVar3) {
          if ((RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
               ::searchString_abi_cxx11_ == '\0') &&
             (iVar4 = __cxa_guard_acquire(&RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
                                           ::searchString_abi_cxx11_), iVar4 != 0)) {
            std::__cxx11::string::string
                      ((string *)
                       RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
                       ::searchString_abi_cxx11_,"Cannot find file \'",(allocator *)&ost);
            __cxa_atexit(std::__cxx11::string::~string,
                         RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
                         ::searchString_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&RccListInputsQt5(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)
                                 ::searchString_abi_cxx11_);
          }
          lVar8 = std::__cxx11::string::find((string *)&qrcEntry,0x6bb208);
          if (lVar8 == -1) {
            if (errorMessage != (string *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ost);
              poVar5 = std::operator<<((ostream *)&ost,
                                       "AutoRcc: Error: Rcc lists unparsable output:\n");
              Quoted(&tag,&qrcEntry);
              poVar5 = std::operator<<(poVar5,(string *)&tag);
              std::operator<<(poVar5,"\n");
              std::__cxx11::string::~string((string *)&tag);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)errorMessage,(string *)&tag);
              std::__cxx11::string::~string((string *)&tag);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ost);
            }
            break;
          }
          std::__cxx11::string::substr((ulong)&ost,(ulong)&qrcEntry);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                     (string *)&ost);
          std::__cxx11::string::~string((string *)&ost);
        }
      }
      std::__cxx11::string::~string((string *)&qrcEntry);
      std::__cxx11::istringstream::~istringstream((istringstream *)&ifs);
    }
    else {
      if (errorMessage != (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar5 = std::operator<<((ostream *)&ifs,"AutoRcc: Error: Rcc list process for ");
        poVar5 = std::operator<<(poVar5,(string *)fileName);
        poVar5 = std::operator<<(poVar5," failed:\n");
        poVar5 = std::operator<<(poVar5,(string *)&qrcContents);
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,(string *)&qrcDir);
        std::operator<<(poVar5,"\n");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)errorMessage,(string *)&ost);
        std::__cxx11::string::~string((string *)&ost);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      }
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&qrcDir);
    std::__cxx11::string::~string((string *)&qrcContents);
    return bVar2;
  }
  qrcContents._M_string_length = 0;
  qrcContents.field_2._M_allocated_capacity =
       qrcContents.field_2._M_allocated_capacity & 0xffffffffffffff00;
  qrcContents._M_dataplus._M_p = (pointer)&qrcContents.field_2;
  std::ifstream::ifstream(&ifs,(fileName->_M_dataplus)._M_p,_S_in);
  uVar1 = *(uint *)((long)auStack_218 + *(long *)(_ifs + -0x18));
  bVar2 = (uVar1 & 5) == 0;
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ost);
    std::ostream::operator<<(&ost,(streambuf *)local_228._M_local_buf);
    std::__cxx11::stringbuf::str();
    errorMessage = &qrcContents;
  }
  else {
    if (errorMessage == (string *)0x0) goto LAB_0043427c;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ost);
    poVar5 = std::operator<<((ostream *)&ost,"AutoRcc: Error: Rcc file not readable:\n");
    Quoted(&qrcDir,fileName);
    poVar5 = std::operator<<(poVar5,(string *)&qrcDir);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&qrcDir);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::string::operator=((string *)errorMessage,(string *)&qrcDir);
  std::__cxx11::string::~string((string *)&qrcDir);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ost);
LAB_0043427c:
  std::ifstream::~ifstream(&ifs);
  if ((uVar1 & 5) == 0) {
    cmsys::SystemTools::GetFilenamePath(&qrcDir,fileName);
    if (qrcDir._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&qrcDir);
    }
    cmsys::RegularExpression::RegularExpression((RegularExpression *)&ifs,"(<file[^<]+)");
    cmsys::RegularExpression::RegularExpression((RegularExpression *)&ost,"(^<file[^>]*>)");
    lVar8 = 0;
    while (bVar3 = cmsys::RegularExpression::find
                             ((RegularExpression *)&ifs,qrcContents._M_dataplus._M_p + lVar8), bVar3
          ) {
      cmsys::RegularExpression::match_abi_cxx11_(&qrcEntry,(RegularExpression *)&ifs,1);
      lVar8 = lVar8 + qrcEntry._M_string_length;
      cmsys::RegularExpression::find((RegularExpression *)&ost,qrcEntry._M_dataplus._M_p);
      cmsys::RegularExpression::match_abi_cxx11_(&tag,(RegularExpression *)&ost,1);
      std::__cxx11::string::substr((ulong)&retVal,(ulong)&qrcEntry);
      std::__cxx11::string::operator=((string *)&qrcEntry,(string *)&retVal);
      std::__cxx11::string::~string((string *)&retVal);
      std::__cxx11::string::~string((string *)&tag);
      bVar3 = cmsys::SystemTools::FileIsFullPath(qrcEntry._M_dataplus._M_p);
      if (!bVar3) {
        std::operator+(&tag,&qrcDir,&qrcEntry);
        std::__cxx11::string::operator=((string *)&qrcEntry,(string *)&tag);
        std::__cxx11::string::~string((string *)&tag);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(files,&qrcEntry);
      std::__cxx11::string::~string((string *)&qrcEntry);
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&ost);
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&ifs);
    std::__cxx11::string::~string((string *)&qrcDir);
  }
  std::__cxx11::string::~string((string *)&qrcContents);
  return bVar2;
}

Assistant:

bool cmQtAutoGeneratorCommon::RccListInputs(const std::string& qtMajorVersion,
                                            const std::string& rccCommand,
                                            const std::string& fileName,
                                            std::vector<std::string>& files,
                                            std::string* errorMessage)
{
  bool allGood = false;
  if (cmsys::SystemTools::FileExists(fileName.c_str())) {
    if (qtMajorVersion == "4") {
      allGood = RccListInputsQt4(fileName, files, errorMessage);
    } else {
      allGood = RccListInputsQt5(rccCommand, fileName, files, errorMessage);
    }
  } else {
    if (errorMessage != CM_NULLPTR) {
      std::ostringstream ost;
      ost << "AutoRcc: Error: Rcc file does not exist:\n"
          << cmQtAutoGeneratorCommon::Quoted(fileName) << "\n";
      *errorMessage = ost.str();
    }
  }
  return allGood;
}